

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_color.c
# Opt level: O0

int TIFFYCbCrToRGBInit(TIFFYCbCrToRGB *ycbcr,float *luma,float *refBlackWhite)

{
  float fVar1;
  float fVar2;
  float local_90;
  float local_88;
  float local_80;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  int32_t Cb;
  int32_t Cr;
  int x;
  int32_t D4;
  float f4;
  int32_t D3;
  float f3;
  int32_t D2;
  float f2;
  int32_t D1;
  float f1;
  int i;
  TIFFRGBValue *clamptab;
  float *refBlackWhite_local;
  float *luma_local;
  TIFFYCbCrToRGB *ycbcr_local;
  
  _TIFFmemset(ycbcr + 1,0,0x100);
  ycbcr->clamptab = (TIFFRGBValue *)&ycbcr[6].Cb_b_tab;
  for (D1 = 0; D1 < 0x100; D1 = D1 + 1) {
    *(char *)((long)&ycbcr[6].Cb_b_tab + (long)D1) = (char)D1;
  }
  _TIFFmemset(&ycbcr[0xb].Cb_g_tab,0xff,0x200);
  ycbcr->Cr_r_tab = (int *)&ycbcr[0x16].Cb_b_tab;
  ycbcr->Cb_b_tab = ycbcr->Cr_r_tab + 0x100;
  ycbcr->Cr_g_tab = ycbcr->Cb_b_tab + 0x100;
  ycbcr->Cb_g_tab = ycbcr->Cr_g_tab + 0x100;
  ycbcr->Y_tab = ycbcr->Cb_g_tab + 0x100;
  fVar1 = 2.0 - (*luma + *luma);
  if (0.0 <= fVar1) {
    local_60 = fVar1;
    if (2.0 < fVar1) {
      local_60 = 2.0;
    }
    local_5c = local_60;
  }
  else {
    local_5c = 0.0;
  }
  local_68 = (*luma * fVar1) / luma[1];
  if (0.0 <= local_68) {
    if (2.0 < local_68) {
      local_68 = 2.0;
    }
    local_64 = local_68;
  }
  else {
    local_64 = 0.0;
  }
  fVar1 = 2.0 - (luma[2] + luma[2]);
  if (0.0 <= fVar1) {
    local_70 = fVar1;
    if (2.0 < fVar1) {
      local_70 = 2.0;
    }
    local_6c = local_70;
  }
  else {
    local_6c = 0.0;
  }
  local_78 = (luma[2] * fVar1) / luma[1];
  if (0.0 <= local_78) {
    if (2.0 < local_78) {
      local_78 = 2.0;
    }
    local_74 = local_78;
  }
  else {
    local_74 = 0.0;
  }
  Cb = -0x80;
  for (D1 = 0; D1 < 0x100; D1 = D1 + 1) {
    fVar1 = (refBlackWhite[5] - 128.0) - (refBlackWhite[4] - 128.0);
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      local_80 = (refBlackWhite[5] - 128.0) - (refBlackWhite[4] - 128.0);
    }
    else {
      local_80 = 1.0;
    }
    fVar1 = CLAMPw(((float)(Cb - (int)(refBlackWhite[4] - 128.0)) * 127.0) / local_80,-4096.0,4096.0
                  );
    fVar2 = (refBlackWhite[3] - 128.0) - (refBlackWhite[2] - 128.0);
    if ((fVar2 != 0.0) || (NAN(fVar2))) {
      local_88 = (refBlackWhite[3] - 128.0) - (refBlackWhite[2] - 128.0);
    }
    else {
      local_88 = 1.0;
    }
    fVar2 = CLAMPw(((float)(Cb - (int)(refBlackWhite[2] - 128.0)) * 127.0) / local_88,-4096.0,4096.0
                  );
    ycbcr->Cr_r_tab[D1] = (int)(local_5c * 65536.0 + 0.5) * (int)fVar1 + 0x8000 >> 0x10;
    ycbcr->Cb_b_tab[D1] = (int)(local_6c * 65536.0 + 0.5) * (int)fVar2 + 0x8000 >> 0x10;
    ycbcr->Cr_g_tab[D1] = -(int)(local_64 * 65536.0 + 0.5) * (int)fVar1;
    ycbcr->Cb_g_tab[D1] = -(int)(local_74 * 65536.0 + 0.5) * (int)fVar2 + 0x8000;
    if ((refBlackWhite[1] - *refBlackWhite != 0.0) || (NAN(refBlackWhite[1] - *refBlackWhite))) {
      local_90 = refBlackWhite[1] - *refBlackWhite;
    }
    else {
      local_90 = 1.0;
    }
    fVar1 = CLAMPw(((float)((Cb + 0x80) - (int)*refBlackWhite) * 255.0) / local_90,-4096.0,4096.0);
    ycbcr->Y_tab[D1] = (int)fVar1;
    Cb = Cb + 1;
  }
  return 0;
}

Assistant:

int TIFFYCbCrToRGBInit(TIFFYCbCrToRGB *ycbcr, float *luma, float *refBlackWhite)
{
    TIFFRGBValue *clamptab;
    int i;

#define LumaRed luma[0]
#define LumaGreen luma[1]
#define LumaBlue luma[2]

    clamptab =
        (TIFFRGBValue *)((uint8_t *)ycbcr +
                         TIFFroundup_32(sizeof(TIFFYCbCrToRGB), sizeof(long)));
    _TIFFmemset(clamptab, 0, 256); /* v < 0 => 0 */
    ycbcr->clamptab = (clamptab += 256);
    for (i = 0; i < 256; i++)
        clamptab[i] = (TIFFRGBValue)i;
    _TIFFmemset(clamptab + 256, 255, 2 * 256); /* v > 255 => 255 */
    ycbcr->Cr_r_tab = (int *)(clamptab + 3 * 256);
    ycbcr->Cb_b_tab = ycbcr->Cr_r_tab + 256;
    ycbcr->Cr_g_tab = (int32_t *)(ycbcr->Cb_b_tab + 256);
    ycbcr->Cb_g_tab = ycbcr->Cr_g_tab + 256;
    ycbcr->Y_tab = ycbcr->Cb_g_tab + 256;

    {
        float f1 = 2 - 2 * LumaRed;
        int32_t D1 = FIX(CLAMP(f1, 0.0F, 2.0F));
        float f2 = LumaRed * f1 / LumaGreen;
        int32_t D2 = -FIX(CLAMP(f2, 0.0F, 2.0F));
        float f3 = 2 - 2 * LumaBlue;
        int32_t D3 = FIX(CLAMP(f3, 0.0F, 2.0F));
        float f4 = LumaBlue * f3 / LumaGreen;
        int32_t D4 = -FIX(CLAMP(f4, 0.0F, 2.0F));
        int x;

#undef LumaBlue
#undef LumaGreen
#undef LumaRed

        /*
         * i is the actual input pixel value in the range 0..255
         * Cb and Cr values are in the range -128..127 (actually
         * they are in a range defined by the ReferenceBlackWhite
         * tag) so there is some range shifting to do here when
         * constructing tables indexed by the raw pixel data.
         */
        for (i = 0, x = -128; i < 256; i++, x++)
        {
            int32_t Cr = (int32_t)CLAMPw(Code2V(x, refBlackWhite[4] - 128.0F,
                                                refBlackWhite[5] - 128.0F, 127),
                                         -128.0F * 32, 128.0F * 32);
            int32_t Cb = (int32_t)CLAMPw(Code2V(x, refBlackWhite[2] - 128.0F,
                                                refBlackWhite[3] - 128.0F, 127),
                                         -128.0F * 32, 128.0F * 32);

            ycbcr->Cr_r_tab[i] = (int32_t)((D1 * Cr + ONE_HALF) >> SHIFT);
            ycbcr->Cb_b_tab[i] = (int32_t)((D3 * Cb + ONE_HALF) >> SHIFT);
            ycbcr->Cr_g_tab[i] = D2 * Cr;
            ycbcr->Cb_g_tab[i] = D4 * Cb + ONE_HALF;
            ycbcr->Y_tab[i] = (int32_t)CLAMPw(
                Code2V(x + 128, refBlackWhite[0], refBlackWhite[1], 255),
                -128.0F * 32, 128.0F * 32);
        }
    }

    return 0;
}